

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWInstanceBase.h
# Opt level: O3

void __thiscall
COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)521>::~InstanceBase
          (InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)521> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)521>).super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceBase_0090f2a8;
  UniqueId::~UniqueId(&this->mInstanciatedObjectId);
  pcVar2 = (this->mName)._M_dataplus._M_p;
  paVar1 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)521>).super_Object._vptr_Object =
       (_func_int **)&PTR__ObjectTemplate_0090f310;
  UniqueId::~UniqueId(&(this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)521>).mUniqueId
                     );
  return;
}

Assistant:

virtual ~InstanceBase() {}